

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableGrow(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *store;
  bool bVar1;
  u32 uVar2;
  Result result;
  RefVec *this_00;
  const_reference pvVar3;
  Table *pTVar4;
  u64 uVar5;
  Ref ref_00;
  Ref ref;
  u64 delta;
  u32 old_size;
  undefined1 local_30 [8];
  Ptr table;
  Ptr *out_trap_local;
  Thread *this_local;
  
  store = this->store_;
  table.root_index_ = (Index)out_trap;
  this_00 = Instance::tables(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RefPtr<wabt::interp::Table>::RefPtr
            ((RefPtr<wabt::interp::Table> *)local_30,store,(Ref)pvVar3->index);
  pTVar4 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_30);
  uVar2 = Table::size(pTVar4);
  uVar5 = PopPtr(this,(Ptr *)local_30);
  ref_00 = Pop<wabt::interp::Ref>(this);
  pTVar4 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_30);
  result = Table::Grow(pTVar4,this->store_,(u32)uVar5,ref_00);
  bVar1 = Failed(result);
  if (bVar1) {
    PushPtr(this,(Ptr *)local_30,0xffffffffffffffff);
  }
  else {
    PushPtr(this,(Ptr *)local_30,(ulong)uVar2);
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_30);
  return Ok;
}

Assistant:

RunResult Thread::DoTableGrow(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32]};
  u32 old_size = table->size();
  auto delta = PopPtr(table);
  auto ref = Pop<Ref>();
  if (Failed(table->Grow(store_, delta, ref))) {
    PushPtr(table, -1);
  } else {
    PushPtr(table, old_size);
  }
  return RunResult::Ok;
}